

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int get_message(mg_connection *conn,char *ebuf,size_t ebuf_len,int *err)

{
  int iVar1;
  int *err_local;
  size_t ebuf_len_local;
  char *ebuf_local;
  mg_connection *conn_local;
  
  if (ebuf_len != 0) {
    *ebuf = '\0';
  }
  *err = 0;
  reset_per_request_attributes(conn);
  if (conn == (mg_connection *)0x0) {
    mg_snprintf((mg_connection *)0x0,(int *)0x0,ebuf,ebuf_len,"%s","Internal error");
    *err = 500;
    conn_local._4_4_ = 0;
  }
  else {
    clock_gettime(1,(timespec *)&conn->req_time);
    iVar1 = read_message((FILE *)0x0,conn,conn->buf,conn->buf_size,&conn->data_len);
    conn->request_len = iVar1;
    if ((conn->request_len < 0) || (conn->request_len <= conn->data_len)) {
      if ((conn->request_len == 0) && (conn->data_len == conn->buf_size)) {
        mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s","Message too large");
        *err = 0x19d;
        conn_local._4_4_ = 0;
      }
      else if (conn->request_len < 1) {
        if (conn->data_len < 1) {
          conn->must_close = 1;
          mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s","No data received");
          *err = 0;
        }
        else {
          mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s","Malformed message");
          *err = 400;
        }
        conn_local._4_4_ = 0;
      }
      else {
        conn_local._4_4_ = 1;
      }
    }
    else {
      mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s","Invalid message size");
      *err = 500;
      conn_local._4_4_ = 0;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static int
get_message(struct mg_connection *conn, char *ebuf, size_t ebuf_len, int *err)
{
	if (ebuf_len > 0) {
		ebuf[0] = '\0';
	}
	*err = 0;

	reset_per_request_attributes(conn);

	if (!conn) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Internal error");
		*err = 500;
		return 0;
	}

	/* Set the time the request was received. This value should be used for
	 * timeouts. */
	clock_gettime(CLOCK_MONOTONIC, &(conn->req_time));

	conn->request_len =
	    read_message(NULL, conn, conn->buf, conn->buf_size, &conn->data_len);
	DEBUG_ASSERT(conn->request_len < 0 || conn->data_len >= conn->request_len);
	if ((conn->request_len >= 0) && (conn->data_len < conn->request_len)) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Invalid message size");
		*err = 500;
		return 0;
	}

	if ((conn->request_len == 0) && (conn->data_len == conn->buf_size)) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Message too large");
		*err = 413;
		return 0;
	}

	if (conn->request_len <= 0) {
		if (conn->data_len > 0) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Malformed message");
			*err = 400;
		} else {
			/* Server did not recv anything -> just close the connection */
			conn->must_close = 1;
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "No data received");
			*err = 0;
		}
		return 0;
	}
	return 1;
}